

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void mergesort_cache2_lcp_2way(uchar **strings,size_t n)

{
  size_t __size;
  MergeResult MVar1;
  lcp_t *lcp_input;
  lcp_t *lcp_output;
  uchar **strings_output;
  unsigned_short *cache_input;
  unsigned_short *cache_output;
  
  __size = n * 8;
  lcp_input = (lcp_t *)malloc(__size);
  lcp_output = (lcp_t *)malloc(__size);
  strings_output = (uchar **)malloc(__size);
  cache_input = (unsigned_short *)malloc(n * 2);
  cache_output = (unsigned_short *)malloc(n * 2);
  MVar1 = mergesort_cache_lcp_2way<false,unsigned_short>
                    (strings,strings_output,lcp_input,lcp_output,cache_input,cache_output,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,__size);
  }
  free(lcp_input);
  free(lcp_output);
  free(strings_output);
  free(cache_input);
  free(cache_output);
  return;
}

Assistant:

void mergesort_cache2_lcp_2way(unsigned char** strings, size_t n)
{ mergesort_cache_lcp_2way<uint16_t>(strings, n); }